

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
AlphaVectorPlanning::GetDuplicateIndices
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,VectorSet *V)

{
  long lVar1;
  double *pdVar2;
  uint uVar3;
  pointer piVar4;
  pointer pdVar5;
  size_type sVar6;
  undefined4 in_EAX;
  int i;
  ulong uVar7;
  long lVar8;
  pointer pdVar9;
  ulong uVar10;
  int s;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined4 uStack_28;
  value_type_conflict4 local_24;
  
  uVar3 = (uint)V->size1_;
  sVar6 = V->size2_;
  _uStack_28 = CONCAT44(0xffffffff,in_EAX);
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,(long)(int)uVar3,&local_24,
             (allocator_type *)((long)&uStack_28 + 3));
  piVar4 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = 1;
  lVar8 = 8;
  auVar12._8_8_ = 0x7fffffffffffffff;
  auVar12._0_8_ = 0x7fffffffffffffff;
  do {
    if (uVar7 == uVar3) {
      return __return_storage_ptr__;
    }
    pdVar5 = (V->data_).data_;
    pdVar9 = pdVar5;
    for (uVar10 = 0; uVar10 != uVar7; uVar10 = uVar10 + 1) {
      uVar11 = 0;
      do {
        if ((uint)sVar6 == uVar11) {
          piVar4[uVar7] = (int)uVar10;
          goto LAB_00415461;
        }
        lVar1 = uVar11 * 8;
        pdVar2 = pdVar9 + uVar11;
        uVar11 = uVar11 + 1;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = *(double *)((long)pdVar5 + lVar1 + V->size2_ * lVar8) - *pdVar2;
        auVar13 = vandpd_avx(auVar13,auVar12);
      } while (auVar13._0_8_ <= 1e-12);
      pdVar9 = pdVar9 + V->size2_;
    }
LAB_00415461:
    uVar7 = uVar7 + 1;
    lVar8 = lVar8 + 8;
  } while( true );
}

Assistant:

vector<int> AlphaVectorPlanning::GetDuplicateIndices(const VectorSet &V)
{
    int nrInV=V.size1(), nrS=V.size2();
    bool equal;

    vector<int> duplicates(nrInV,-1);

    for(int i=1;i!=nrInV;++i) // start at 1, first is never a duplicate
    {
        for(int j=0;j!=i;++j) // loop over all previous vectors
        {
            equal=true;
            for(int s=0;s!=nrS;++s)
            {
                if(abs(V(i,s)-V(j,s))>PROB_PRECISION)
                {
                    equal=false;
                    break; // if 1 number differs, they are not equal
                }
            }
            if(equal)
            {
                duplicates[i]=j;
                break; // we need to find only the first duplicate
            }
        }
    }

#if 0 // reduce verbosity
    PrintVectorCout(duplicates); cout << endl;
#endif
    return(duplicates);
}